

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_offset_list(Dwarf_Debug dbg,Dwarf_Off offset,Dwarf_Bool is_info,Dwarf_Off **offbuf,
                     Dwarf_Unsigned *offcnt,Dwarf_Error *error)

{
  Dwarf_Chain_2_conflict space;
  Dwarf_Chain_2_conflict prev;
  Dwarf_Off cur_off;
  Dwarf_Chain_2 *ppDStack_98;
  int dres;
  Dwarf_Chain_2_conflict *plast;
  Dwarf_Chain_2_conflict head_chain;
  Dwarf_Chain_2_conflict curr_chain;
  Dwarf_Off *ret_offsets;
  Dwarf_Unsigned i;
  Dwarf_Unsigned off_count;
  Dwarf_Die pDStack_60;
  int res;
  Dwarf_Die cur_die;
  Dwarf_Die sib_die;
  Dwarf_Die child;
  Dwarf_Die die;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *offcnt_local;
  Dwarf_Off **offbuf_local;
  Dwarf_Off DStack_20;
  Dwarf_Bool is_info_local;
  Dwarf_Off offset_local;
  Dwarf_Debug dbg_local;
  
  child = (Dwarf_Die)0x0;
  sib_die = (Dwarf_Die)0x0;
  cur_die = (Dwarf_Die)0x0;
  pDStack_60 = (Dwarf_Die)0x0;
  off_count._4_4_ = 0;
  i = 0;
  ret_offsets = (Dwarf_Off *)0x0;
  curr_chain = (Dwarf_Chain_2_conflict)0x0;
  head_chain = (Dwarf_Chain_2_conflict)0x0;
  plast = (Dwarf_Chain_2_conflict *)0x0;
  ppDStack_98 = (Dwarf_Chain_2 *)&plast;
  die = (Dwarf_Die)error;
  error_local = (Dwarf_Error *)offcnt;
  offcnt_local = (Dwarf_Unsigned *)offbuf;
  offbuf_local._4_4_ = is_info;
  DStack_20 = offset;
  offset_local = (Dwarf_Off)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_offset_list()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    *offbuf = (Dwarf_Off *)0x0;
    *offcnt = 0;
    off_count._4_4_ = dwarf_offdie_b(dbg,offset,is_info,&child,error);
    dbg_local._4_4_ = off_count._4_4_;
    if (((off_count._4_4_ == 0) &&
        (off_count._4_4_ = dwarf_child(child,&sib_die,(Dwarf_Error *)die),
        dbg_local._4_4_ = off_count._4_4_, off_count._4_4_ != 1)) && (off_count._4_4_ != -1)) {
      dwarf_dealloc_die(child);
      pDStack_60 = sib_die;
      sib_die = (Dwarf_Die)0x0;
      while( true ) {
        if (off_count._4_4_ == 0) {
          cur_off._4_4_ = 0;
          prev = (Dwarf_Chain_2_conflict)0x0;
          cur_off._4_4_ = dwarf_dieoffset(pDStack_60,(Dwarf_Off *)&prev,(Dwarf_Error *)die);
          if ((cur_off._4_4_ != 0) && (cur_off._4_4_ == 1)) {
            free_dwarf_offsets_chain((Dwarf_Debug)offset_local,(Dwarf_Chain_2_conflict)plast);
            dwarf_dealloc_die(pDStack_60);
            return 1;
          }
          head_chain = (Dwarf_Chain_2_conflict)_dwarf_get_alloc((Dwarf_Debug)offset_local,'=',1);
          if (head_chain == (Dwarf_Chain_2_conflict)0x0) {
            free_dwarf_offsets_chain((Dwarf_Debug)offset_local,(Dwarf_Chain_2_conflict)plast);
            dwarf_dealloc_die(pDStack_60);
            _dwarf_error((Dwarf_Debug)offset_local,(Dwarf_Error *)die,0x3e);
            return 1;
          }
          head_chain->ch_item = (Dwarf_Off)prev;
          i = i + 1;
          *ppDStack_98 = head_chain;
          ppDStack_98 = &head_chain->ch_next;
        }
        cur_die = (Dwarf_Die)0x0;
        off_count._4_4_ = dwarf_siblingof_c(pDStack_60,&cur_die,(Dwarf_Error *)die);
        if (pDStack_60 != child) {
          dwarf_dealloc((Dwarf_Debug)offset_local,pDStack_60,8);
        }
        if (off_count._4_4_ == 1) {
          free_dwarf_offsets_chain((Dwarf_Debug)offset_local,(Dwarf_Chain_2_conflict)plast);
          return off_count._4_4_;
        }
        if (off_count._4_4_ == -1) break;
        pDStack_60 = cur_die;
      }
      curr_chain = (Dwarf_Chain_2_conflict)_dwarf_get_alloc((Dwarf_Debug)offset_local,'\x19',i);
      if (curr_chain == (Dwarf_Chain_2_conflict)0x0) {
        free_dwarf_offsets_chain((Dwarf_Debug)offset_local,(Dwarf_Chain_2_conflict)plast);
        _dwarf_error((Dwarf_Debug)offset_local,(Dwarf_Error *)die,0x3e);
        dbg_local._4_4_ = 1;
      }
      else {
        head_chain = (Dwarf_Chain_2_conflict)plast;
        for (ret_offsets = (Dwarf_Off *)0x0; space = head_chain, ret_offsets < i;
            ret_offsets = (Dwarf_Off *)((long)ret_offsets + 1)) {
          (&curr_chain->ch_item)[(long)ret_offsets] = head_chain->ch_item;
          head_chain = head_chain->ch_next;
          dwarf_dealloc((Dwarf_Debug)offset_local,space,0x3d);
        }
        *offcnt_local = (Dwarf_Unsigned)curr_chain;
        *error_local = (Dwarf_Error)i;
        dbg_local._4_4_ = 0;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_offset_list(Dwarf_Debug dbg,
    Dwarf_Off    offset, Dwarf_Bool      is_info,
    Dwarf_Off  **offbuf, Dwarf_Unsigned *offcnt,
    Dwarf_Error *error)
{
    Dwarf_Die die = 0;
    Dwarf_Die child = 0;
    Dwarf_Die sib_die = 0;
    Dwarf_Die cur_die = 0;
    int       res = 0;
    Dwarf_Unsigned off_count = 0;
    Dwarf_Unsigned i = 0;
    Dwarf_Off    *ret_offsets = 0;
    Dwarf_Chain_2 curr_chain = 0;
    Dwarf_Chain_2 head_chain = 0;
    Dwarf_Chain_2 *plast = &head_chain;

    CHECK_DBG(dbg,error,"dwarf_offset_list()");
    *offbuf = NULL;
    *offcnt = 0;
    res = dwarf_offdie_b(dbg,offset,is_info,&die,error);
    if (DW_DLV_OK != res) {
        return res;
    }

    res = dwarf_child(die,&child,error);
    if (DW_DLV_ERROR == res || DW_DLV_NO_ENTRY == res) {
        return res;
    }
    dwarf_dealloc_die(die);
    cur_die = child;
    child = 0;
    for (;;) {
        if (DW_DLV_OK == res) {
            int dres = 0;
            Dwarf_Off cur_off = 0;

            dres = dwarf_dieoffset(cur_die,&cur_off,error);
            if (dres == DW_DLV_OK) {
                /* Normal. use cur_off. */
            } else if (dres == DW_DLV_ERROR) {
                free_dwarf_offsets_chain(dbg,head_chain);
                dwarf_dealloc_die(cur_die);
                return DW_DLV_ERROR;
            } else { /* DW_DLV_NO_ENTRY */
                /* Impossible, dwarf_dieoffset never returns this */
            }
            /* Record offset in current entry chain */
            curr_chain = (Dwarf_Chain_2)_dwarf_get_alloc(
                dbg,DW_DLA_CHAIN_2,1);
            if (curr_chain == NULL) {
                free_dwarf_offsets_chain(dbg,head_chain);
                dwarf_dealloc_die(cur_die);
                _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
                return DW_DLV_ERROR;
            }

            /* Put current offset on singly_linked list. */
            curr_chain->ch_item = cur_off;
            ++off_count;
            (*plast) = curr_chain;
            plast = &(curr_chain->ch_next);
        }
        /* Move to next sibling next sibling */
        sib_die = 0;
        res = dwarf_siblingof_c(cur_die,&sib_die,error);
        if (cur_die != die) {
            dwarf_dealloc(dbg,cur_die,DW_DLA_DIE);
        }
        if (DW_DLV_ERROR == res) {
            free_dwarf_offsets_chain(dbg,head_chain);
            return res;
        }
        if (DW_DLV_NO_ENTRY == res) {
            /* Done at this level. */
            break;
        }
        /* res == DW_DLV_OK */
        cur_die = sib_die;
    }

    /* Points to contiguous block of Dwarf_Off's. */
    ret_offsets = (Dwarf_Off *) _dwarf_get_alloc(dbg,
        DW_DLA_UARRAY, off_count);
    if (ret_offsets == NULL) {
        free_dwarf_offsets_chain(dbg,head_chain);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    /*  Store offsets in contiguous block,
        and deallocate the chain. */
    curr_chain = head_chain;
    for (i = 0; i < off_count; i++) {
        Dwarf_Chain_2 prev =0;

        ret_offsets[i] = curr_chain->ch_item;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN_2);
    }
    *offbuf = ret_offsets;
    *offcnt = off_count;
    return DW_DLV_OK;
}